

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.cpp
# Opt level: O2

void Diligent::ReserveSpaceForPipelineResourceSignatureDesc
               (FixedLinearAllocator *Allocator,PipelineResourceSignatureDesc *Desc)

{
  PipelineResourceDesc *pPVar1;
  Char *str;
  char *pcVar2;
  Uint32 i_1;
  Uint32 i;
  ulong uVar3;
  long lVar4;
  string msg;
  string local_50;
  
  FixedLinearAllocator::AddSpace<Diligent::PipelineResourceDesc>
            (Allocator,(ulong)Desc->NumResources);
  FixedLinearAllocator::AddSpace<Diligent::ImmutableSamplerDesc>
            (Allocator,(ulong)Desc->NumImmutableSamplers);
  lVar4 = 0;
  for (uVar3 = 0; uVar3 < Desc->NumResources; uVar3 = uVar3 + 1) {
    pPVar1 = Desc->Resources;
    pcVar2 = *(char **)((long)&pPVar1->Name + lVar4);
    if (pcVar2 == (char *)0x0) {
      FormatString<char[97]>(&local_50,(char (*) [97])0x7ed8f9);
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"ReserveSpaceForPipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0x1b8);
      std::__cxx11::string::~string((string *)&local_50);
      pcVar2 = *(char **)((long)&pPVar1->Name + lVar4);
    }
    if (*pcVar2 == '\0') {
      FormatString<char[98]>(&local_50,(char (*) [98])0x7ed96a);
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"ReserveSpaceForPipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0x1b9);
      std::__cxx11::string::~string((string *)&local_50);
    }
    if (*(int *)((long)&pPVar1->ShaderStages + lVar4) == 0) {
      FormatString<char[120]>
                (&local_50,
                 (char (*) [120])
                 "ShaderStages can\'t be SHADER_TYPE_UNKNOWN. This error should\'ve been caught by ValidatePipelineResourceSignatureDesc()."
                );
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"ReserveSpaceForPipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0x1ba);
      std::__cxx11::string::~string((string *)&local_50);
    }
    if (*(int *)((long)&pPVar1->ArraySize + lVar4) == 0) {
      FormatString<char[99]>
                (&local_50,
                 (char (*) [99])
                 "ArraySize can\'t be 0. This error should\'ve been caught by ValidatePipelineResourceSignatureDesc()."
                );
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"ReserveSpaceForPipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0x1bb);
      std::__cxx11::string::~string((string *)&local_50);
    }
    FixedLinearAllocator::AddSpaceForString(Allocator,*(Char **)((long)&pPVar1->Name + lVar4),0);
    lVar4 = lVar4 + 0x18;
  }
  lVar4 = 0;
  for (uVar3 = 0; uVar3 < Desc->NumImmutableSamplers; uVar3 = uVar3 + 1) {
    str = *(Char **)((long)(Desc->ImmutableSamplers->Desc).BorderColor + lVar4 + -0x24);
    if (str == (Char *)0x0) {
      FormatString<char[113]>
                (&local_50,
                 (char (*) [113])
                 "SamplerOrTextureName can\'t be null. This error should\'ve been caught by ValidatePipelineResourceSignatureDesc()."
                );
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"ReserveSpaceForPipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0x1c3);
      std::__cxx11::string::~string((string *)&local_50);
    }
    if (*str == '\0') {
      FormatString<char[114]>
                (&local_50,
                 (char (*) [114])
                 "SamplerOrTextureName can\'t be empty. This error should\'ve been caught by ValidatePipelineResourceSignatureDesc()."
                );
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"ReserveSpaceForPipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0x1c4);
      std::__cxx11::string::~string((string *)&local_50);
    }
    FixedLinearAllocator::AddSpaceForString(Allocator,str,0);
    FixedLinearAllocator::AddSpaceForString
              (Allocator,
               *(Char **)((long)(Desc->ImmutableSamplers->Desc).BorderColor + lVar4 + -0x1c),0);
    lVar4 = lVar4 + 0x48;
  }
  if (Desc->UseCombinedTextureSamplers != false) {
    FixedLinearAllocator::AddSpaceForString(Allocator,Desc->CombinedSamplerSuffix,0);
  }
  return;
}

Assistant:

void ReserveSpaceForPipelineResourceSignatureDesc(FixedLinearAllocator& Allocator, const PipelineResourceSignatureDesc& Desc)
{
    Allocator.AddSpace<PipelineResourceDesc>(Desc.NumResources);
    Allocator.AddSpace<ImmutableSamplerDesc>(Desc.NumImmutableSamplers);

    for (Uint32 i = 0; i < Desc.NumResources; ++i)
    {
        const PipelineResourceDesc& Res = Desc.Resources[i];

        VERIFY(Res.Name != nullptr, "Name can't be null. This error should've been caught by ValidatePipelineResourceSignatureDesc().");
        VERIFY(Res.Name[0] != '\0', "Name can't be empty. This error should've been caught by ValidatePipelineResourceSignatureDesc().");
        VERIFY(Res.ShaderStages != SHADER_TYPE_UNKNOWN, "ShaderStages can't be SHADER_TYPE_UNKNOWN. This error should've been caught by ValidatePipelineResourceSignatureDesc().");
        VERIFY(Res.ArraySize != 0, "ArraySize can't be 0. This error should've been caught by ValidatePipelineResourceSignatureDesc().");

        Allocator.AddSpaceForString(Res.Name);
    }

    for (Uint32 i = 0; i < Desc.NumImmutableSamplers; ++i)
    {
        const char* SamOrTexName = Desc.ImmutableSamplers[i].SamplerOrTextureName;
        VERIFY(SamOrTexName != nullptr, "SamplerOrTextureName can't be null. This error should've been caught by ValidatePipelineResourceSignatureDesc().");
        VERIFY(SamOrTexName[0] != '\0', "SamplerOrTextureName can't be empty. This error should've been caught by ValidatePipelineResourceSignatureDesc().");
        Allocator.AddSpaceForString(SamOrTexName);
        Allocator.AddSpaceForString(Desc.ImmutableSamplers[i].Desc.Name);
    }

    if (Desc.UseCombinedTextureSamplers)
        Allocator.AddSpaceForString(Desc.CombinedSamplerSuffix);
}